

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O1

void __thiscall
FOOLElimination::collectSorts
          (FOOLElimination *this,VList *vars,TermStack *typeVars,TermStack *termVars,
          TermStack *allVars,TermStack *termVarSorts)

{
  uint uVar1;
  bool bVar2;
  TermList TVar3;
  Entry *pEVar4;
  TermList TVar5;
  TermList *pTVar6;
  ulong uVar7;
  TermList **ppTVar8;
  ulong uVar9;
  TermStack *this_00;
  uint64_t uVar10;
  uint local_4c;
  FOOLElimination *local_48;
  TermList **local_40;
  TermList **local_38;
  
  local_48 = this;
  if (vars != (VList *)0x0) {
    local_48 = (FOOLElimination *)&this->_varSorts;
    local_38 = &termVars->_cursor;
    local_40 = &typeVars->_cursor;
    do {
      uVar1 = vars->_head;
      vars = vars->_tail;
      TVar3 = Kernel::AtomicSort::defaultSort();
      local_4c = uVar1;
      pEVar4 = ::Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
               findEntry((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_48,&local_4c);
      if (pEVar4 != (Entry *)0x0) {
        TVar3._content = (pEVar4->_val)._content;
      }
      TVar5 = Kernel::AtomicSort::superSort();
      if (TVar3._content == TVar5._content) {
        if (allVars->_cursor == allVars->_end) {
          ::Lib::Stack<Kernel::TermList>::expand(allVars);
        }
        uVar10 = (uint64_t)(uVar1 * 4 + 1);
        pTVar6 = allVars->_cursor;
        pTVar6->_content = uVar10;
        allVars->_cursor = pTVar6 + 1;
        ppTVar8 = local_40;
        this_00 = typeVars;
        if (typeVars->_cursor == typeVars->_end) {
LAB_006f4ca7:
          ::Lib::Stack<Kernel::TermList>::expand(this_00);
        }
      }
      else {
        if (termVarSorts->_cursor == termVarSorts->_end) {
          ::Lib::Stack<Kernel::TermList>::expand(termVarSorts);
        }
        pTVar6 = termVarSorts->_cursor;
        pTVar6->_content = TVar3._content;
        termVarSorts->_cursor = pTVar6 + 1;
        uVar10 = (uint64_t)(uVar1 * 4 + 1);
        ppTVar8 = local_38;
        this_00 = termVars;
        if (termVars->_cursor == termVars->_end) goto LAB_006f4ca7;
      }
      pTVar6 = *ppTVar8;
      pTVar6->_content = uVar10;
      *ppTVar8 = pTVar6 + 1;
    } while (vars != (List<unsigned_int> *)0x0);
  }
  pTVar6 = termVars->_stack;
  if (termVars->_cursor != pTVar6) {
    uVar7 = 0;
    uVar9 = 1;
    do {
      uVar10 = pTVar6[uVar7]._content;
      if (allVars->_cursor == allVars->_end) {
        ::Lib::Stack<Kernel::TermList>::expand(allVars);
      }
      pTVar6 = allVars->_cursor;
      pTVar6->_content = uVar10;
      allVars->_cursor = pTVar6 + 1;
      pTVar6 = termVars->_stack;
      bVar2 = uVar9 < (ulong)((long)termVars->_cursor - (long)pTVar6 >> 3);
      uVar7 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar2);
  }
  Kernel::SortHelper::normaliseArgSorts(typeVars,termVarSorts);
  return;
}

Assistant:

void FOOLElimination::collectSorts(VList* vars, TermStack& typeVars,
                                   TermStack& termVars, TermStack& allVars, TermStack& termVarSorts)
{
  VList::Iterator fvi(vars);
  while (fvi.hasNext()) {
    unsigned var = fvi.next();
    ASS_REP(_varSorts.find(var), var);
    TermList sort = _varSorts.get(var, AtomicSort::defaultSort());
    if(sort == AtomicSort::superSort()){
      //variable is a type var
      allVars.push(TermList(var, false));
      typeVars.push(TermList(var, false));
    } else {
      termVarSorts.push(sort);
      termVars.push(TermList(var, false));
    }   
  }
  
  for(unsigned i = 0; i < termVars.size(); i++){
    allVars.push(termVars[i]);
  }

  SortHelper::normaliseArgSorts(typeVars, termVarSorts);
}